

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IForReader.h
# Opt level: O1

void __thiscall IForReader::IForReader(IForReader *this,ifstream *ifs,ostream *os,int deep)

{
  IAbstractReader::IAbstractReader(&this->super_IAbstractReader,ifs,os,deep,true);
  (this->super_IAbstractReader)._vptr_IAbstractReader = (_func_int **)&PTR_getWord_00110c38;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_IAbstractReader).m_dataType,0,
             (char *)(this->super_IAbstractReader).m_dataType._M_string_length,0x10c088);
  return;
}

Assistant:

explicit IForReader(std::ifstream* ifs,std::ostream* os,int deep) : IAbstractReader(ifs, os, deep, true) {
        m_dataType = "\'For\' Block";
    }